

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O2

bool __thiscall
Clasp::ShortImplicationsGraph::add(ShortImplicationsGraph *this,ImpType t,bool learnt,Literal *lits)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  undefined7 in_register_00000011;
  Literal p;
  pointer this_00;
  Literal q;
  Literal r;
  Literal LVar4;
  left_type local_48;
  left_type local_44;
  right_type local_40;
  ImpType local_34;
  
  uVar1 = lits->rep_;
  uVar2 = lits[1].rep_;
  if (t == ternary_imp) {
    r.rep_ = lits[2].rep_ & 0xfffffffe;
  }
  else {
    r.rep_ = 2;
  }
  p.rep_ = uVar1 & 0xfffffffe;
  q.rep_ = uVar2 & 0xfffffffe;
  if (this->shared_ == false) {
    LVar4.rep_ = r.rep_;
    if (learnt) {
      p.rep_ = uVar1 | 1;
      q.rep_ = uVar2 | 1;
      LVar4.rep_ = r.rep_ | 1;
    }
    this_00 = (this->graph_).ebo_.buf + (p.rep_ >> 1 ^ 1);
    local_48.rep_ = q.rep_;
    local_44.rep_ = p.rep_;
    if (t == binary_imp) {
      bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
      push_left((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)
                this_00,&local_48);
      bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
      push_left((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)
                ((this->graph_).ebo_.buf + ((ulong)(local_48.rep_ >> 1) ^ 1)),&local_44);
    }
    else {
      local_40.second.rep_ = LVar4.rep_;
      local_40.first.rep_ = q.rep_;
      bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
      push_right((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)
                 this_00,&local_40);
      local_40.first.rep_ = p.rep_;
      bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
      push_right((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)
                 ((this->graph_).ebo_.buf + (q.rep_ >> 1 ^ 1)),&local_40);
      local_40.second.rep_ = q.rep_;
      bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
      push_right((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)
                 ((this->graph_).ebo_.buf + (r.rep_ >> 1 ^ 1)),&local_40);
    }
  }
  else {
    if ((!learnt) ||
       (local_48.rep_ = q.rep_, local_44.rep_ = p.rep_, local_34 = t,
       bVar3 = ImplicationList::hasLearnt((this->graph_).ebo_.buf + ((ulong)(uVar1 >> 1) ^ 1),q,r),
       bVar3)) {
      return false;
    }
    ImplicationList::addLearnt((this->graph_).ebo_.buf + (uVar1 >> 1 ^ 1),q,r);
    ImplicationList::addLearnt((this->graph_).ebo_.buf + ((ulong)(uVar2 >> 1) ^ 1),p,r);
    if (local_34 == ternary_imp) {
      ImplicationList::addLearnt((this->graph_).ebo_.buf + (r.rep_ >> 1 ^ 1),p,q);
    }
  }
  this->bin_[(ulong)(t == ternary_imp) * 2 + (CONCAT71(in_register_00000011,learnt) & 0xffffffff)] =
       this->bin_
       [(ulong)(t == ternary_imp) * 2 + (CONCAT71(in_register_00000011,learnt) & 0xffffffff)] + 1;
  return true;
}

Assistant:

bool ShortImplicationsGraph::add(ImpType t, bool learnt, const Literal* lits) {
	uint32& stats= (t == ternary_imp ? tern_ : bin_)[learnt];
	Literal p = lits[0], q = lits[1], r = (t == ternary_imp ? lits[2] : lit_false());
	p.unflag(), q.unflag(), r.unflag();
	if (!shared_) {
		if (learnt) { p.flag(), q.flag(), r.flag(); }
		if (t == binary_imp) {
			getList(~p).push_left(q);
			getList(~q).push_left(p);
		}
		else {
			getList(~p).push_right(std::make_pair(q, r));
			getList(~q).push_right(std::make_pair(p, r));
			getList(~r).push_right(std::make_pair(p, q));
		}
		++stats;
		return true;
	}
#if CLASP_HAS_THREADS
	else if (learnt && !getList(~p).hasLearnt(q, r)) {
		getList(~p).addLearnt(q, r);
		getList(~q).addLearnt(p, r);
		if (t == ternary_imp) {
			getList(~r).addLearnt(p, q);
		}
		++stats;
		return true;
	}
#endif
	return false;
}